

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::UpdateInternal(cmCTestGIT *this)

{
  cmCTest *this_00;
  bool bVar1;
  string custom;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GITUpdateCustom",&local_51);
  cmCTest::GetCTestConfiguration(&local_50,this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_50._M_string_length == 0) {
    bVar1 = UpdateByFetchAndReset(this);
  }
  else {
    bVar1 = UpdateByCustom(this,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool cmCTestGIT::UpdateInternal()
{
  std::string custom = this->CTest->GetCTestConfiguration("GITUpdateCustom");
  if (!custom.empty()) {
    return this->UpdateByCustom(custom);
  }
  return this->UpdateByFetchAndReset();
}